

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

_Bool upb_strtable_lookup2(upb_strtable *t,char *key,size_t len,upb_value *v)

{
  uint32_t uVar1;
  uint uVar2;
  int iVar3;
  ulong __n;
  upb_tabent *puVar4;
  
  uVar1 = _upb_Hash(key,len,0x3ac888);
  if ((t->t).count != 0) {
    uVar2 = uVar1 & (t->t).mask;
    puVar4 = (t->t).entries;
    if (puVar4[uVar2].key.num != 0) {
      puVar4 = puVar4 + uVar2;
      do {
        __n = (ulong)((puVar4->key).str)->size;
        if (__n == len) {
          if (__n == 0) goto LAB_00291c28;
          iVar3 = bcmp((puVar4->key).str + 1,key,__n);
          if (iVar3 == 0) goto LAB_00291c28;
        }
        puVar4 = puVar4->next;
      } while (puVar4 != (_upb_tabent *)0x0);
    }
  }
  puVar4 = (upb_tabent *)0x0;
LAB_00291c28:
  if ((v != (upb_value *)0x0) && (puVar4 != (upb_tabent *)0x0)) {
    v->val = (puVar4->val).val;
  }
  return puVar4 != (upb_tabent *)0x0;
}

Assistant:

bool upb_strtable_lookup2(const upb_strtable* t, const char* key, size_t len,
                          upb_value* v) {
  uint32_t hash = _upb_Hash_NoSeed(key, len);
  return lookup(&t->t, strkey2(key, len), v, hash, &streql);
}